

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_edge_ratio_post_report(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL r1;
  REF_DBL r0;
  REF_DBL ratio;
  REF_INT node_list [500];
  int local_40;
  REF_INT max_node;
  REF_INT nnode;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT local_20;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  node_list[499] = 500;
  ref_node._4_4_ = new_node;
  local_20 = node1;
  new_node_local = node0;
  _node1_local = ref_grid;
  uVar1 = ref_node_ratio((REF_NODE)ref_cell,node0,node1,&r0);
  if (uVar1 == 0) {
    uVar1 = ref_node_ratio((REF_NODE)ref_cell,new_node_local,ref_node._4_4_,&r1);
    if (uVar1 == 0) {
      uVar1 = ref_node_ratio((REF_NODE)ref_cell,new_node_local,ref_node._4_4_,
                             (REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        printf("orig ratio %f split %f %f\n",r0,r1,_ref_private_macro_code_rss_1);
        if ((_node1_local->surf == 0) && (_node1_local->twod == 0)) {
          _nnode = _node1_local->cell[8];
        }
        else {
          _nnode = _node1_local->cell[3];
        }
        uVar1 = ref_cell_node_list_around
                          (_nnode,ref_node._4_4_,node_list[499],&local_40,(REF_INT *)&ratio);
        if (uVar1 == 0) {
          for (max_node = 0; max_node < local_40; max_node = max_node + 1) {
            uVar1 = ref_node_ratio((REF_NODE)ref_cell,ref_node._4_4_,node_list[(long)max_node + -2],
                                   &r0);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x45,"ref_split_edge_ratio_post_report",(ulong)uVar1,"ratio");
              return uVar1;
            }
            printf("new ratio %f\n",r0);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x43,"ref_split_edge_ratio_post_report",(ulong)uVar1,"around");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x38,"ref_split_edge_ratio_post_report",(ulong)uVar1,"ratio1");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x37,
             "ref_split_edge_ratio_post_report",(ulong)uVar1,"ratio0");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x36,
           "ref_split_edge_ratio_post_report",(ulong)uVar1,"ratio");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_split_edge_ratio_post_report(REF_GRID ref_grid,
                                                           REF_INT node0,
                                                           REF_INT node1,
                                                           REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT i, nnode, max_node = 500;
  REF_INT node_list[500];
  REF_DBL ratio;
  REF_DBL r0, r1;

  RSS(ref_node_ratio(ref_node, node0, node1, &ratio), "ratio");
  RSS(ref_node_ratio(ref_node, node0, new_node, &r0), "ratio0");
  RSS(ref_node_ratio(ref_node, node0, new_node, &r1), "ratio1");
  printf("orig ratio %f split %f %f\n", ratio, r0, r1);

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_cell_node_list_around(ref_cell, new_node, max_node, &nnode,
                                node_list),
      "around");
  for (i = 0; i < nnode; i++) {
    RSS(ref_node_ratio(ref_node, new_node, node_list[i], &ratio), "ratio");
    printf("new ratio %f\n", ratio);
  }

  return REF_SUCCESS;
}